

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

int cholu(double *A,int N)

{
  int iVar1;
  double *U22;
  size_t __n;
  ulong uVar2;
  
  U22 = (double *)malloc((long)N * (long)N * 8);
  iVar1 = rcholu(A,N,N,U22);
  if (0 < N) {
    __n = 0;
    uVar2 = 0;
    do {
      if (__n != 0) {
        memset(A + uVar2,0,__n);
      }
      uVar2 = (ulong)(uint)((int)uVar2 + N);
      __n = __n + 8;
    } while ((ulong)(uint)N << 3 != __n);
  }
  free(U22);
  return iVar1;
}

Assistant:

int cholu(double *A, int N) {
	int stride,i,j,t,sc;
	double *U22;
	U22 = (double*) malloc(sizeof(double) * N * N);
	stride = N; 
	
	sc = rcholu(A,N,stride,U22);
	
	for(i=0; i < N;++i) {
		t = i *N;
		for(j=0;j < i;++j) {
			A[t+j] = 0.;
		}
	}

	free(U22);
	return sc;
	
}